

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall mp::SPAdapter::ExtractRandomTerms(SPAdapter *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  int *piVar6;
  pointer pRVar7;
  double *pdVar8;
  uint *puVar9;
  reference pvVar10;
  double **ppdVar11;
  int __c;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  undefined8 *in_RDI;
  double dVar13;
  double coef;
  int con_index;
  int n;
  int j;
  int elt_index;
  int var_index;
  int core_var_index;
  SparseMatrix<double_*> var2con;
  int num_vars;
  double *coefs;
  VariableCollector collector;
  int element_index;
  int index;
  int core_con_index_1;
  int end_3;
  int k_1;
  iterator end_2;
  iterator i_2;
  int next;
  int i_1;
  int start;
  int core_con_index;
  int end_1;
  int k;
  iterator end;
  iterator i;
  int num_stage2_cons;
  int num_stage1_cons;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  ColProblem *in_stack_fffffffffffffde0;
  ColProblem *this_00;
  double *in_stack_fffffffffffffde8;
  value_type vVar14;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf0;
  SparseMatrix<double> *in_stack_fffffffffffffe10;
  vector<int,_std::allocator<int>_> *this_01;
  SPAdapter *in_stack_fffffffffffffe18;
  VariableCollector *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe34;
  SparseMatrix<double_*> *in_stack_fffffffffffffe38;
  SparseMatrix<double> *in_stack_fffffffffffffe40;
  VariableCollector *in_stack_fffffffffffffea0;
  uint local_138;
  int local_134;
  int local_12c;
  SparseMatrix<double_*> local_128;
  int local_e0;
  double *local_d0;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  RandomVarInfo *local_48;
  __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
  local_40;
  int local_38;
  int local_34;
  int local_30;
  value_type local_2c;
  int local_28;
  int local_24;
  RandomVarInfo *local_20;
  __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
  local_18;
  value_type local_10;
  value_type local_c;
  
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2e),0);
  local_c = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2e),1);
  local_10 = *pvVar5;
  SparseMatrix<double>::resize_major
            ((SparseMatrix<double> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
  local_18._M_current =
       (RandomVarInfo *)
       std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
       begin((vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_> *)
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_20 = (RandomVarInfo *)
             std::
             vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
             end((vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                  *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
                        *)in_stack_fffffffffffffde0,
                       (__normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
                        *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    if (!bVar2) break;
    in_stack_fffffffffffffea0 = (VariableCollector *)*in_RDI;
    __gnu_cxx::
    __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
    ::operator->(&local_18);
    local_24 = ColProblem::col_start(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    __gnu_cxx::
    __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
    ::operator->(&local_18);
    local_28 = ColProblem::col_start(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    for (; local_24 != local_28; local_24 = local_24 + 1) {
      iVar3 = ColProblem::row_index(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x34),(long)iVar3);
      local_2c = *pvVar5;
      piVar6 = SparseMatrix<double>::start
                         ((SparseMatrix<double> *)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffddc);
      *piVar6 = *piVar6 + 1;
    }
    __gnu_cxx::
    __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
    ::operator++(&local_18);
  }
  local_30 = 0;
  for (local_34 = 1; iVar3 = local_30, local_34 <= local_10; local_34 = local_34 + 1) {
    piVar6 = SparseMatrix<double>::start
                       ((SparseMatrix<double> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc)
    ;
    iVar1 = local_30;
    local_38 = iVar3 + *piVar6;
    piVar6 = SparseMatrix<double>::start
                       ((SparseMatrix<double> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc)
    ;
    *piVar6 = iVar1;
    local_30 = local_38;
  }
  SparseMatrix<double>::resize_elements
            ((SparseMatrix<double> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
  local_40._M_current =
       (RandomVarInfo *)
       std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
       begin((vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_> *)
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_48 = (RandomVarInfo *)
             std::
             vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
             end((vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                  *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
                        *)in_stack_fffffffffffffde0,
                       (__normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
                        *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
    ::operator->(&local_40);
    local_4c = ColProblem::col_start(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    __gnu_cxx::
    __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
    ::operator->(&local_40);
    local_50 = ColProblem::col_start(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    for (; local_4c != local_50; local_4c = local_4c + 1) {
      iVar3 = ColProblem::row_index(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x34),(long)iVar3);
      local_54 = *pvVar5;
      local_58 = (local_54 - local_c) + 1;
      puVar9 = (uint *)SparseMatrix<double>::start
                                 ((SparseMatrix<double> *)in_stack_fffffffffffffde0,
                                  in_stack_fffffffffffffddc);
      local_5c = *puVar9;
      *puVar9 = local_5c + 1;
      pRVar7 = __gnu_cxx::
               __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
               ::operator->(&local_40);
      iVar3 = pRVar7->var_index;
      piVar6 = (int *)SparseMatrix<double>::index
                                ((SparseMatrix<double> *)(in_RDI + 9),(char *)(ulong)local_5c,__c);
      *piVar6 = iVar3;
      dVar13 = ColProblem::value(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      pdVar8 = SparseMatrix<double>::value
                         ((SparseMatrix<double> *)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffddc);
      *pdVar8 = -dVar13;
    }
    __gnu_cxx::
    __normal_iterator<mp::SPAdapter::RandomVarInfo_*,_std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>_>
    ::operator++(&local_40);
  }
  anon_unknown_19::VariableCollector::VariableCollector
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  local_d0 = ColProblem::values((ColProblem *)0x1c87ff);
  anon_unknown_19::VariableCollector::Collect(in_stack_fffffffffffffea0);
  local_e0 = SPAdapter::num_vars((SPAdapter *)0x1c8835);
  SparseMatrix<double_*>::SparseMatrix((SparseMatrix<double_*> *)in_stack_fffffffffffffde0);
  internal::Transpose(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34)
  ;
  BasicProblem<mp::BasicProblemParams<int>_>::num_vars
            ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1c88b6);
  ColProblem::col_start(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(double *)in_stack_fffffffffffffde0
            );
  for (local_12c = 0; local_12c < local_e0; local_12c = local_12c + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)local_12c);
    local_134 = ColProblem::col_start(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    puVar9 = (uint *)SparseMatrix<double_*>::start
                               ((SparseMatrix<double_*> *)in_stack_fffffffffffffde0,
                                in_stack_fffffffffffffddc);
    local_138 = *puVar9;
    piVar6 = SparseMatrix<double_*>::start
                       ((SparseMatrix<double_*> *)in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffddc);
    iVar3 = *piVar6;
    uVar12 = extraout_RDX;
    for (; (int)local_138 < iVar3; local_138 = local_138 + 1) {
      this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x31);
      piVar6 = (int *)SparseMatrix<double_*>::index(&local_128,(char *)(ulong)local_138,(int)uVar12)
      ;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(*piVar6 + local_c))
      ;
      iVar1 = *pvVar5;
      this_00 = in_stack_fffffffffffffde0;
      while( true ) {
        iVar4 = ColProblem::row_index(this_00,in_stack_fffffffffffffddc);
        if (iVar4 == iVar1) break;
        local_134 = local_134 + 1;
      }
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12),
                           (long)local_134);
      dVar13 = *pvVar10;
      ppdVar11 = SparseMatrix<double_*>::value
                           ((SparseMatrix<double_*> *)this_00,in_stack_fffffffffffffddc);
      in_stack_fffffffffffffde0 = (ColProblem *)(dVar13 + **ppdVar11);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12),
                           (long)local_134);
      vVar14 = *pvVar10;
      ppdVar11 = SparseMatrix<double_*>::value
                           ((SparseMatrix<double_*> *)this_00,in_stack_fffffffffffffddc);
      **ppdVar11 = vVar14;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12),
                           (long)local_134);
      *pvVar10 = (value_type)in_stack_fffffffffffffde0;
      uVar12 = extraout_RDX_00;
    }
  }
  SparseMatrix<double_*>::~SparseMatrix((SparseMatrix<double_*> *)in_stack_fffffffffffffde0);
  anon_unknown_19::VariableCollector::~VariableCollector
            ((VariableCollector *)in_stack_fffffffffffffde0);
  return;
}

Assistant:

void SPAdapter::ExtractRandomTerms() {
  int num_stage1_cons = num_stage_cons_[0];
  int num_stage2_cons = num_stage_cons_[1];

  // A matrix containing linear terms involving random variables.
  // The major dimension is equal to the number of second-stage constraints.
  linear_random_.resize_major(num_stage2_cons);

  // Count random variables in second-stage constraints.
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i) {
    for (int k = problem_.col_start(i->var_index),
         end = problem_.col_start(i->var_index + 1); k != end; ++k) {
       int core_con_index = con_orig2core_[problem_.row_index(k)];
       assert(core_con_index >= num_stage1_cons);
       ++linear_random_.start(core_con_index - num_stage1_cons + 1);
    }
  }
  // Acummulate counts to get vector starts.
  int start = 0;
  for (int i = 1; i <= num_stage2_cons; ++i) {
    int next = start + linear_random_.start(i);
    linear_random_.start(i) = start;
    start = next;
  }

  // Map second-stage constraints to random variables that appear linearly
  // in them.
  linear_random_.resize_elements(start);
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i) {
    for (int k = problem_.col_start(i->var_index),
         end = problem_.col_start(i->var_index + 1); k != end; ++k) {
       int core_con_index = con_orig2core_[problem_.row_index(k)];
       assert(core_con_index >= num_stage1_cons);
       int index = core_con_index - num_stage1_cons + 1;
       int element_index = linear_random_.start(index)++;
       linear_random_.index(element_index) = i->var_index;
       linear_random_.value(element_index) = -problem_.value(k);
    }
  }

  // Get variables that appear in nonlinear parts of constraint expressions.
  VariableCollector collector(*this, vars_in_nonlinear_);
  const double *coefs = problem_.values();
  collector.Collect();

  // Convert vars_in_nonlinear_ to column-major form.
  int num_vars = this->num_vars();
  SparseMatrix<double*> var2con;
  internal::Transpose(vars_in_nonlinear_, var2con, num_vars);

  // Combine the first scenario with core coefficients.
  core_coefs_.assign(coefs, coefs + problem_.col_start(problem_.num_vars()));
  for (int core_var_index = 0; core_var_index < num_vars; ++core_var_index) {
    int var_index = var_core2orig_[core_var_index];
    int elt_index = problem_.col_start(var_index);
    for (int j = var2con.start(core_var_index),
         n = var2con.start(core_var_index + 1); j < n; ++j) {
      int con_index = con_core2orig_[var2con.index(j) + num_stage1_cons];
      while (problem_.row_index(elt_index) != con_index)
        ++elt_index;
      assert(elt_index < problem_.col_start(var_index + 1));
      double coef = core_coefs_[elt_index] + *var2con.value(j);
      *var2con.value(j) = core_coefs_[elt_index];
      core_coefs_[elt_index] = coef;
    }
  }
}